

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O0

void IDAAdjFree(void *ida_mem)

{
  IDAadjMemRec *__ptr;
  IDAMem in_RDI;
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  
  if ((in_RDI != (IDAMem)0x0) && (in_RDI->ida_adjMallocDone != 0)) {
    __ptr = in_RDI->ida_adj_mem;
    while (__ptr->ck_mem != (IDAckpntMemRec *)0x0) {
      IDAAckpntDelete((IDAckpntMem *)in_RDI);
    }
    IDAAdataFree(in_RDI);
    while (__ptr->IDAB_mem != (IDABMemRec *)0x0) {
      IDAAbckpbDelete((IDABMem *)in_RDI);
    }
    free(__ptr);
    in_RDI->ida_adj_mem = (IDAadjMemRec *)0x0;
  }
  return;
}

Assistant:

void IDAAdjFree(void* ida_mem)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;

  if (ida_mem == NULL) { return; }
  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_adjMallocDone)
  {
    /* Data for adjoint. */
    IDAADJ_mem = IDA_mem->ida_adj_mem;

    /* Delete check points one by one */
    while (IDAADJ_mem->ck_mem != NULL)
    {
      IDAAckpntDelete(&(IDAADJ_mem->ck_mem));
    }

    IDAAdataFree(IDA_mem);

    /* Free all backward problems. */
    while (IDAADJ_mem->IDAB_mem != NULL)
    {
      IDAAbckpbDelete(&(IDAADJ_mem->IDAB_mem));
    }

    /* Free IDAA memory. */
    free(IDAADJ_mem);

    IDA_mem->ida_adj_mem = NULL;
  }
}